

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O3

void Fxu_PairAllocStorage(Fxu_Var *pVar,int nCubes)

{
  Fxu_Pair ***pppFVar1;
  Fxu_Pair **__s;
  ulong uVar2;
  long lVar3;
  
  pVar->nCubes = nCubes;
  lVar3 = (long)nCubes;
  pppFVar1 = (Fxu_Pair ***)malloc(lVar3 * 8);
  pVar->ppPairs = pppFVar1;
  __s = (Fxu_Pair **)malloc((ulong)(uint)(nCubes * nCubes) << 3);
  *pppFVar1 = __s;
  memset(__s,0,lVar3 * lVar3 * 8);
  if (1 < nCubes) {
    uVar2 = 1;
    do {
      pVar->ppPairs[uVar2] = pVar->ppPairs[uVar2 - 1] + lVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)nCubes != uVar2);
  }
  return;
}

Assistant:

void Fxu_PairAllocStorage( Fxu_Var * pVar, int nCubes )
{
    int k;
//    assert( pVar->nCubes == 0 );
    pVar->nCubes  = nCubes;
    // allocate memory for all the pairs
    pVar->ppPairs    = ABC_ALLOC( Fxu_Pair **, nCubes );
    pVar->ppPairs[0] = ABC_ALLOC( Fxu_Pair *,  nCubes * nCubes );
    memset( pVar->ppPairs[0], 0, sizeof(Fxu_Pair *) * nCubes * nCubes );
    for ( k = 1; k < nCubes; k++ )
        pVar->ppPairs[k] = pVar->ppPairs[k-1] + nCubes;
}